

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O2

void deflate_make_huffman_codes(deflate_freqs *freqs,deflate_codes *codes)

{
  deflate_make_huffman_code(0x120,0xe,freqs->litlen,(codes->lens).litlen,(u32 *)codes);
  deflate_make_huffman_code(0x20,0xf,freqs->offset,(codes->lens).offset,(codes->codewords).offset);
  return;
}

Assistant:

static void
deflate_make_huffman_codes(const struct deflate_freqs *freqs,
			   struct deflate_codes *codes)
{
	deflate_make_huffman_code(DEFLATE_NUM_LITLEN_SYMS,
				  MAX_LITLEN_CODEWORD_LEN,
				  freqs->litlen,
				  codes->lens.litlen,
				  codes->codewords.litlen);

	deflate_make_huffman_code(DEFLATE_NUM_OFFSET_SYMS,
				  MAX_OFFSET_CODEWORD_LEN,
				  freqs->offset,
				  codes->lens.offset,
				  codes->codewords.offset);
}